

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O3

object * __thiscall
msgpack::v1::adaptor::
convert<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
::operator()(convert<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
             *this,object *o,
            tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *v)

{
  object *poVar1;
  undefined8 *puVar2;
  convert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_29;
  object local_28;
  
  if ((o->super_object).type == ARRAY) {
    if ((o->super_object).via.array.size != 0) {
      poVar1 = (o->super_object).via.array.ptr;
      local_28.via.array.ptr = (poVar1->super_object).via.array.ptr;
      local_28.type = (poVar1->super_object).type;
      local_28._4_4_ = *(undefined4 *)&(poVar1->super_object).field_0x4;
      local_28.via.u64 = (poVar1->super_object).via.u64;
      convert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::operator()(&local_29,(object *)&local_28,(string *)v);
    }
    return o;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_001649f8;
  __cxa_throw(puVar2,&type_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

msgpack::object const& operator()(
        msgpack::object const& o,
        std::tuple<Args...>& v) const {
        if(o.type != msgpack::type::ARRAY) { throw msgpack::type_error(); }
        StdTupleConverter<decltype(v), sizeof...(Args)>::convert(o, v);
        return o;
    }